

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall crsGA::Logger::startProcessingMessages(Logger *this)

{
  Logger *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  LOCK();
  (this->_exit)._M_base._M_i = false;
  UNLOCK();
  local_20 = processEntries;
  local_18 = 0;
  local_30 = this;
  std::thread::thread<void(crsGA::Logger::*)(),crsGA::Logger*,void>
            (&local_28,(type *)&local_20,&local_30);
  std::thread::operator=(&this->_thread,&local_28);
  std::thread::~thread(&local_28);
  return;
}

Assistant:

void Logger::startProcessingMessages()
{
    _exit = false;
    _thread = std::thread(&Logger::processEntries, this);
}